

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

double __thiscall chrono::ChOptimizer::Eval_fx(ChOptimizer *this,double *x)

{
  Scalar SVar1;
  Scalar *pSVar2;
  int i;
  long index;
  ChVectorDynamic<> Vin;
  ChVectorDynamic<> Vout;
  Matrix<double,__1,_1,_0,__1,_1> local_48;
  Matrix<double,__1,_1,_0,__1,_1> local_38;
  int local_24;
  
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_48,&this->C_vars);
  local_24 = 1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_38,&local_24);
  for (index = 0;
      index < local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows; index = index + 1) {
    SVar1 = x[index];
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_48,
                        index);
    *pSVar2 = SVar1;
  }
  (*(code *)**(undefined8 **)this->afunction)(this->afunction,&local_38,&local_48);
  this->fx_evaluations = this->fx_evaluations + 1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_38,0);
  SVar1 = *pSVar2;
  Eigen::internal::handmade_aligned_free
            (local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  Eigen::internal::handmade_aligned_free
            (local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return SVar1;
}

Assistant:

double ChOptimizer::Eval_fx(double x[]) {
    ChVectorDynamic<> Vin(C_vars);
    ChVectorDynamic<> Vout(1);

    for (int i = 0; i < Vin.size(); i++)
        Vin(i) = x[i];
    afunction->Eval(Vout, Vin);
    fx_evaluations++;
    return Vout(0);
}